

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlGetNamespace(xmlParserCtxtPtr ctxt,xmlChar *prefix)

{
  ulong uVar1;
  long lVar2;
  xmlChar *pxVar3;
  ulong uVar4;
  
  if (ctxt->str_xml == prefix) {
    return ctxt->str_xml_ns;
  }
  uVar4 = (ulong)(uint)ctxt->nsNr;
  do {
    if ((int)uVar4 < 2) {
      return (xmlChar *)0x0;
    }
    uVar1 = uVar4 - 2;
    lVar2 = uVar4 - 2;
    uVar4 = uVar1;
  } while (ctxt->nsTab[lVar2] != prefix);
  pxVar3 = ctxt->nsTab[(ulong)((int)uVar1 + 2U & 0x7fffffff) - 1];
  if (prefix != (xmlChar *)0x0) {
    return pxVar3;
  }
  if (*pxVar3 == '\0') {
    pxVar3 = (xmlChar *)0x0;
  }
  return pxVar3;
}

Assistant:

static const xmlChar *
xmlGetNamespace(xmlParserCtxtPtr ctxt, const xmlChar *prefix) {
    int i;

    if (prefix == ctxt->str_xml) return(ctxt->str_xml_ns);
    for (i = ctxt->nsNr - 2;i >= 0;i-=2)
        if (ctxt->nsTab[i] == prefix) {
	    if ((prefix == NULL) && (*ctxt->nsTab[i + 1] == 0))
	        return(NULL);
	    return(ctxt->nsTab[i + 1]);
	}
    return(NULL);
}